

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

bool wasm::DataFlow::allInputsIdentical(Node *node)

{
  Id IVar1;
  bool bVar2;
  bool bVar3;
  Node *pNVar4;
  Node *pNVar5;
  ulong uVar6;
  Index i;
  ulong uVar7;
  Index i_00;
  Index i_01;
  
  if (node->type == Phi) {
    pNVar4 = Node::getValue(node,1);
    uVar7 = 2;
    do {
      uVar6 = (long)(node->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(node->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
      bVar3 = uVar6 <= uVar7;
      if (uVar6 <= uVar7) {
        return bVar3;
      }
      pNVar5 = Node::getValue(node,(Index)uVar7);
      bVar2 = Node::operator!=(pNVar4,pNVar5);
      uVar7 = (ulong)((Index)uVar7 + 1);
    } while (!bVar2);
  }
  else {
    if (node->type == Expr) {
      IVar1 = ((node->field_1).expr)->_id;
      i_00 = 0;
      if (IVar1 == BinaryId) {
        i_01 = 1;
      }
      else {
        if (IVar1 != SelectId) {
          return false;
        }
        i_01 = 2;
        i_00 = 1;
      }
      pNVar4 = Node::getValue(node,i_00);
      pNVar5 = Node::getValue(node,i_01);
      bVar3 = Node::operator==(pNVar4,pNVar5);
      return bVar3;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

inline bool allInputsIdentical(Node* node) {
  switch (node->type) {
    case Node::Type::Expr: {
      if (node->expr->is<Binary>()) {
        return *(node->getValue(0)) == *(node->getValue(1));
      } else if (node->expr->is<Select>()) {
        return *(node->getValue(1)) == *(node->getValue(2));
      }
      break;
    }
    case Node::Type::Phi: {
      auto* first = node->getValue(1);
      // Check if any of the others are not equal
      for (Index i = 2; i < node->values.size(); i++) {
        auto* curr = node->getValue(i);
        if (*first != *curr) {
          return false;
        }
      }
      return true;
    }
    default: {}
  }
  return false;
}